

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O3

cbtScalar __thiscall
cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact
          (cbtConvexConcaveCollisionAlgorithm *this,cbtCollisionObject *body0,
          cbtCollisionObject *body1,cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  ulong uVar7;
  float fVar8;
  uint uVar9;
  cbtCollisionObject *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  cbtTransform triInv;
  uint local_130;
  uint local_12c;
  undefined4 local_128;
  uint local_120;
  uint local_11c;
  undefined4 local_118;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_100;
  uint uStack_fc;
  uint local_f8;
  cbtTriangleCallback local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 local_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 local_78;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  cbtScalar local_18;
  float local_14;
  
  pcVar10 = body0;
  if (this->m_isSwapped != false) {
    pcVar10 = body1;
  }
  fVar8 = (pcVar10->m_interpolationWorldTransform).m_origin.m_floats[1] -
          (pcVar10->m_worldTransform).m_origin.m_floats[1];
  auVar11 = ZEXT416((uint)((pcVar10->m_interpolationWorldTransform).m_origin.m_floats[0] -
                          (pcVar10->m_worldTransform).m_origin.m_floats[0]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar11,auVar11);
  auVar13 = ZEXT416((uint)((pcVar10->m_interpolationWorldTransform).m_origin.m_floats[2] -
                          (pcVar10->m_worldTransform).m_origin.m_floats[2]));
  auVar11 = vfmadd231ss_fma(auVar11,auVar13,auVar13);
  if (pcVar10->m_ccdMotionThreshold * pcVar10->m_ccdMotionThreshold <= auVar11._0_4_) {
    if (this->m_isSwapped != false) {
      body1 = body0;
    }
    cbtTransform::inverse(&body1->m_worldTransform);
    uVar9 = body1->m_collisionShape->m_shapeType - 0x19;
    if (10 < uVar9) {
      return 1.0;
    }
    auVar11 = vbroadcastss_avx512vl(ZEXT416(local_12c));
    auVar12 = vbroadcastss_avx512vl(ZEXT416(local_11c));
    auVar13 = vbroadcastss_avx512vl(ZEXT416(local_10c));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(pcVar10->m_worldTransform).m_basis.m_el[1].m_floats;
    auVar14 = vbroadcastss_avx512vl(ZEXT416(local_130));
    auVar15 = vbroadcastss_avx512vl(ZEXT416(local_120));
    auVar16 = vbroadcastss_avx512vl(ZEXT416(local_110));
    cVar1 = (pcVar10->m_worldTransform).m_basis.m_el[1].m_floats[2];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(pcVar10->m_worldTransform).m_basis.m_el[0].m_floats;
    cVar2 = (pcVar10->m_worldTransform).m_basis.m_el[0].m_floats[2];
    auVar34._4_4_ = local_128;
    auVar34._0_4_ = local_128;
    auVar34._8_4_ = local_128;
    auVar34._12_4_ = local_128;
    auVar36._4_4_ = local_118;
    auVar36._0_4_ = local_118;
    auVar36._8_4_ = local_118;
    auVar36._12_4_ = local_118;
    auVar17 = vbroadcastss_avx512vl(ZEXT416(local_108));
    cVar3 = (pcVar10->m_worldTransform).m_origin.m_floats[2];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(pcVar10->m_interpolationWorldTransform).m_basis.m_el[1].m_floats;
    cVar4 = (pcVar10->m_interpolationWorldTransform).m_basis.m_el[1].m_floats[2];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)(pcVar10->m_interpolationWorldTransform).m_basis.m_el[0].m_floats;
    cVar5 = (pcVar10->m_interpolationWorldTransform).m_basis.m_el[0].m_floats[2];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *(ulong *)(pcVar10->m_worldTransform).m_basis.m_el[2].m_floats;
    cVar6 = (pcVar10->m_worldTransform).m_basis.m_el[2].m_floats[2];
    auVar18 = vmulps_avx512vl(auVar11,auVar20);
    auVar19 = vmulps_avx512vl(auVar20,auVar12);
    auVar20 = vmulps_avx512vl(auVar20,auVar13);
    auVar21 = vmulss_avx512f(auVar11,ZEXT416((uint)cVar1));
    auVar22 = vmulss_avx512f(ZEXT416((uint)cVar1),auVar12);
    auVar23 = vmulss_avx512f(auVar12,ZEXT416((uint)cVar4));
    auVar18 = vfmadd231ps_avx512vl(auVar18,auVar24,auVar14);
    auVar19 = vfmadd231ps_avx512vl(auVar19,auVar24,auVar15);
    auVar20 = vfmadd231ps_avx512vl(auVar20,auVar16,auVar24);
    auVar24 = vmulss_avx512f(ZEXT416((uint)cVar1),auVar13);
    cVar1 = (pcVar10->m_worldTransform).m_origin.m_floats[1];
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)cVar2),auVar14);
    auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)cVar2),auVar15);
    auVar23 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)cVar5),auVar15);
    auVar24 = vfmadd231ss_avx512f(auVar24,auVar16,ZEXT416((uint)cVar2));
    cVar2 = (pcVar10->m_worldTransform).m_origin.m_floats[0];
    auVar25 = vmulss_avx512f(auVar11,ZEXT416((uint)cVar1));
    auVar26 = vmulss_avx512f(auVar12,ZEXT416((uint)cVar1));
    auVar27 = vmulss_avx512f(auVar13,ZEXT416((uint)cVar1));
    auVar28 = vmulss_avx512f(auVar11,ZEXT416((uint)cVar4));
    auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar2),auVar14);
    auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar2),auVar15);
    auVar27 = vfmadd231ss_avx512f(auVar27,auVar16,ZEXT416((uint)cVar2));
    auVar29 = vmulps_avx512vl(auVar11,auVar31);
    auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)cVar5),auVar14);
    auVar29 = vfmadd231ps_avx512vl(auVar29,auVar32,auVar14);
    auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar3),auVar34);
    auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar3),auVar36);
    auVar27 = vfmadd231ss_avx512f(auVar27,auVar17,ZEXT416((uint)cVar3));
    auVar30 = vmulps_avx512vl(auVar12,auVar31);
    auVar31 = vmulps_avx512vl(auVar13,auVar31);
    auVar30 = vfmadd231ps_avx512vl(auVar30,auVar32,auVar15);
    auVar31 = vfmadd231ps_avx512vl(auVar31,auVar16,auVar32);
    auVar32 = vmulss_avx512f(auVar13,ZEXT416((uint)cVar4));
    cVar1 = (pcVar10->m_interpolationWorldTransform).m_origin.m_floats[1];
    auVar32 = vfmadd231ss_avx512f(auVar32,auVar16,ZEXT416((uint)cVar5));
    cVar2 = (pcVar10->m_interpolationWorldTransform).m_origin.m_floats[0];
    auVar11 = vmulss_avx512f(auVar11,ZEXT416((uint)cVar1));
    auVar33 = vmulss_avx512f(auVar13,ZEXT416((uint)cVar1));
    auVar14 = vfmadd231ss_avx512f(auVar11,ZEXT416((uint)cVar2),auVar14);
    auVar13 = vaddss_avx512f(ZEXT416(local_100),auVar25);
    auVar11 = vaddss_avx512f(auVar26,ZEXT416(uStack_fc));
    auVar12 = vmulss_avx512f(auVar12,ZEXT416((uint)cVar1));
    auVar25 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)cVar2),auVar16);
    auVar26 = vaddss_avx512f(auVar27,ZEXT416(local_f8));
    auVar16 = vxorps_avx512vl(auVar16,auVar16);
    cVar1 = (pcVar10->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[2];
    auVar12 = vfmadd231ss_avx512f(auVar12,ZEXT416((uint)cVar2),auVar15);
    cVar2 = (pcVar10->m_interpolationWorldTransform).m_origin.m_floats[2];
    uVar7 = *(ulong *)(pcVar10->m_interpolationWorldTransform).m_basis.m_el[2].m_floats;
    auVar11 = vinsertps_avx512f(auVar13,auVar11,0x10);
    auVar14 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)cVar2),auVar34);
    auVar12 = vfmadd231ss_avx512f(auVar12,ZEXT416((uint)cVar2),auVar36);
    auVar15 = vfmadd231ss_avx512f(auVar25,auVar17,ZEXT416((uint)cVar2));
    auVar16._0_4_ = auVar26._0_4_;
    auVar14 = vaddss_avx512f(ZEXT416(local_100),auVar14);
    auVar12 = vaddss_avx512f(ZEXT416(uStack_fc),auVar12);
    auVar15 = vaddss_avx512f(ZEXT416(local_f8),auVar15);
    local_a8 = vmovlhps_avx512f(auVar11,auVar16);
    auVar11 = vucomiss_avx512f(auVar14);
    if (10 < uVar9) {
      auVar13 = auVar14;
    }
    auVar25 = vfmadd231ps_fma(auVar18,auVar35,auVar34);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar6),auVar34);
    auVar19 = vfmadd231ps_fma(auVar19,auVar35,auVar36);
    auVar27 = vfmadd231ps_avx512vl(auVar20,auVar17,auVar35);
    auVar20 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar6),auVar36);
    auVar24 = vfmadd231ss_avx512f(auVar24,auVar17,ZEXT416((uint)cVar6));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar7;
    auVar29 = vfmadd231ps_avx512vl(auVar29,auVar18,auVar34);
    auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)cVar1),auVar34);
    auVar30 = vfmadd231ps_avx512vl(auVar30,auVar18,auVar36);
    auVar23 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)cVar1),auVar36);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar7;
    auVar31 = vfmadd231ps_avx512vl(auVar31,auVar17,auVar22);
    auVar32 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)cVar1),auVar17);
    auVar18 = vucomiss_avx512f(auVar12);
    auVar17 = vinsertps_avx512f(auVar14,auVar12,0x10);
    auVar22 = auVar18;
    if (10 < uVar9) {
      auVar22 = auVar12;
    }
    auVar11 = vmaxss_avx512f(auVar14,auVar11);
    auVar14 = vminss_avx512f(auVar15,auVar26);
    auVar12 = vmaxss_avx512f(auVar12,auVar18);
    auVar18 = vmaxss_avx512f(auVar15,auVar26);
    vmovlps_avx512f(auVar16);
    local_18 = pcVar10->m_ccdSweptSphereRadius;
    local_e0._vptr_cbtTriangleCallback = (_func_int **)&PTR__cbtTriangleCallback_00b48638;
    local_d8 = vmovlps_avx(auVar25);
    local_68 = vmovlhps_avx(auVar17,ZEXT416(auVar15._0_4_));
    local_d0 = auVar21._0_4_;
    local_cc = 0;
    local_c8 = vmovlps_avx(auVar19);
    local_c0 = auVar20._0_4_;
    local_bc = 0;
    local_b8 = vmovlps_avx(auVar27);
    local_b0 = auVar24._0_4_;
    local_ac = 0;
    local_98 = vmovlps_avx(auVar29);
    local_90 = auVar28._0_4_;
    local_8c = 0;
    local_88 = vmovlps_avx(auVar30);
    local_80 = auVar23._0_4_;
    local_7c = 0;
    local_78 = vmovlps_avx(auVar31);
    local_70 = auVar32._0_4_;
    local_6c = 0;
    vsubss_avx512f(auVar13,ZEXT416((uint)local_18));
    vsubss_avx512f(auVar22,ZEXT416((uint)local_18));
    auVar13 = ZEXT416((uint)local_18);
    vsubss_avx512f(auVar14,auVar13);
    vaddss_avx512f(auVar13,auVar11);
    vaddss_avx512f(auVar13,auVar12);
    vaddss_avx512f(auVar13,auVar18);
    local_14 = pcVar10->m_hitFraction;
    (*body1->m_collisionShape->_vptr_cbtCollisionShape[0x10])();
    fVar8 = local_14;
    if (local_14 < pcVar10->m_hitFraction) {
      pcVar10->m_hitFraction = local_14;
      cbtTriangleCallback::~cbtTriangleCallback(&local_e0);
      return fVar8;
    }
    cbtTriangleCallback::~cbtTriangleCallback(&local_e0);
  }
  return 1.0;
}

Assistant:

cbtScalar cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* body0, cbtCollisionObject* body1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	cbtCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	cbtCollisionObject* triBody = m_isSwapped ? body0 : body1;

	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the cbtConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	cbtScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return cbtScalar(1.);
	}

	//const cbtVector3& from = convexbody->m_worldTransform.getOrigin();
	//cbtVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	cbtTransform triInv = triBody->getWorldTransform().inverse();
	cbtTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	cbtTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback : public cbtTriangleCallback
	{
		cbtTransform m_ccdSphereFromTrans;
		cbtTransform m_ccdSphereToTrans;
		cbtTransform m_meshTransform;

		cbtScalar m_ccdSphereRadius;
		cbtScalar m_hitFraction;

		LocalTriangleSphereCastCallback(const cbtTransform& from, const cbtTransform& to, cbtScalar ccdSphereRadius, cbtScalar hitFraction)
			: m_ccdSphereFromTrans(from),
			  m_ccdSphereToTrans(to),
			  m_ccdSphereRadius(ccdSphereRadius),
			  m_hitFraction(hitFraction)
		{
		}

		virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
		{
			BT_PROFILE("processTriangle");
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			cbtTransform ident;
			ident.setIdentity();
			cbtConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			cbtSphereShape pointShape(m_ccdSphereRadius);
			cbtTriangleShape triShape(triangle[0], triangle[1], triangle[2]);
			cbtVoronoiSimplexSolver simplexSolver;
			cbtSubsimplexConvexCast convexCaster(&pointShape, &triShape, &simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans, m_ccdSphereToTrans,
											  ident, ident, castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}
		}
	};

	if (triBody->getCollisionShape()->isConcave())
	{
		cbtVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		cbtVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		cbtScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= cbtVector3(ccdRadius0, ccdRadius0, ccdRadius0);
		rayAabbMax += cbtVector3(ccdRadius0, ccdRadius0, ccdRadius0);

		cbtScalar curHitFraction = cbtScalar(1.);  //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal, convexToLocal,
														convexbody->getCcdSweptSphereRadius(), curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		cbtCollisionObject* concavebody = triBody;

		cbtConcaveShape* triangleMesh = (cbtConcaveShape*)concavebody->getCollisionShape();

		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback, rayAabbMin, rayAabbMax);
		}

		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction(raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return cbtScalar(1.);
}